

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O2

void __thiscall
slang::ast::SFormat::TypeVisitor::visit<slang::ast::PropertyType>
          (TypeVisitor *this,PropertyType *param_1,ConstantValue *arg)

{
  string local_58;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_38;
  
  if (this->isStringLiteral == true) {
    ConstantValue::convertToStr((ConstantValue *)&local_38,arg);
    ConstantValue::toString_abi_cxx11_(&local_58,(ConstantValue *)&local_38,0x80,false,false);
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)&this->buffer,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
    std::__cxx11::string::~string((string *)&local_58);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_38);
  }
  else {
    ConstantValue::toString_abi_cxx11_((string *)&local_38,arg,0x80,false,false);
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)&this->buffer,(char *)local_38._0_8_,
               (char *)(local_38._8_8_ + local_38._0_8_));
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void visit(const T&, const ConstantValue& arg) {
        if (isStringLiteral)
            buffer.append(arg.convertToStr().toString());
        else
            buffer.append(arg.toString());
    }